

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

pair<bool,_bool> kratos::correct_port_direction(Port *port1,Port *port2,Generator *top)

{
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  Generator *pGVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
  _Var5;
  Port *pPVar6;
  bool same_direction;
  byte bVar7;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
  local_38;
  Generator *pGVar3;
  undefined4 extraout_var_00;
  
  iVar2 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0xd])();
  pGVar3 = (Generator *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0xd])(port2);
  pGVar4 = (Generator *)CONCAT44(extraout_var_00,iVar2);
  if (pGVar3 == top && pGVar3 == pGVar4) {
    iVar2 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0x1d])(port1);
    if ((char)iVar2 == '\0') {
LAB_00169ab9:
      iVar2 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0x1d])(port2);
      if ((char)iVar2 != '\0') {
        iVar2 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0x1d])(port1);
        pPVar6 = port2;
        if ((char)iVar2 == '\0') goto LAB_00169b29;
      }
      bVar7 = false;
    }
    else {
      iVar2 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0x1d])(port2);
      pPVar6 = port1;
      if ((char)iVar2 != '\0') goto LAB_00169ab9;
LAB_00169b29:
      bVar7 = *(byte *)(pPVar6[1].super_Var.super_IRNode._vptr_IRNode + 0x10) ^ 1;
    }
    check_direction(port1,port2,(bool)bVar7);
    bVar7 = bVar7 ^ port1->direction_ != In;
  }
  else if (pGVar3 == top) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &pGVar4->super_enable_shared_from_this<kratos::Generator>);
    _Var5._M_cur = (__node_type *)
                   std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(top->children_)._M_h,(key_type *)(local_48 + 0x98));
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_38._M_cur = _Var5._M_cur;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      _Var5._M_cur = local_38._M_cur;
    }
    if (_Var5._M_cur == (__node_type *)0x0) goto LAB_00169ae5;
    check_direction(port1,port2,true);
    bVar7 = port1->direction_ != In;
  }
  else {
LAB_00169ae5:
    if (pGVar4 != top) {
LAB_00169aee:
      iVar2 = (*(pGVar3->super_IRNode)._vptr_IRNode[4])(pGVar3);
      local_38._M_cur = (__node_type *)CONCAT44(extraout_var_01,iVar2);
      iVar2 = (*(pGVar4->super_IRNode)._vptr_IRNode[4])(pGVar4);
      if (local_38._M_cur == (__node_type *)CONCAT44(extraout_var_02,iVar2)) {
        iVar2 = (*(pGVar3->super_IRNode)._vptr_IRNode[4])(pGVar3);
        if ((Generator *)CONCAT44(extraout_var_03,iVar2) == top) {
          same_direction = false;
          goto LAB_00169c11;
        }
      }
      bVar7 = 0;
      uVar1 = 0;
      goto LAB_00169c25;
    }
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &pGVar3->super_enable_shared_from_this<kratos::Generator>);
    _Var5._M_cur = (__node_type *)
                   std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(top->children_)._M_h,(key_type *)(local_48 + 0x98));
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_38._M_cur = _Var5._M_cur;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      _Var5._M_cur = local_38._M_cur;
    }
    if (_Var5._M_cur == (__node_type *)0x0) goto LAB_00169aee;
    same_direction = true;
LAB_00169c11:
    check_direction(port1,port2,same_direction);
    bVar7 = port1->direction_ == In;
  }
  uVar1 = 0x100;
LAB_00169c25:
  return (pair<bool,_bool>)(uVar1 | bVar7);
}

Assistant:

std::pair<bool, bool> correct_port_direction(Port *port1, Port *port2, Generator *top) {
    auto *parent1 = port1->generator();
    auto *parent2 = port2->generator();
    std::shared_ptr<AssignStmt> stmt;
    if (parent1 == parent2 && parent1 == top) {
        // it's the same module
        // by default same direction is fault, however, for modport ones, it is the same direction
        bool interface_port_wire = false;
        if (port1->is_interface() && !port2->is_interface()) {
            auto *port_i = reinterpret_cast<InterfacePort *>(port1);
            const auto *it = port_i->interface();
            interface_port_wire = !it->is_port();
        } else if (port2->is_interface() && !port1->is_interface()) {
            auto *port_i = reinterpret_cast<InterfacePort *>(port2);
            const auto *it = port_i->interface();
            interface_port_wire = !it->is_port();
        }
        check_direction(port1, port2, interface_port_wire);
        bool dir_in = port1->port_direction() == PortDirection::In;
        return {(interface_port_wire == dir_in), true};
    } else {
        if (parent1 == top && top->has_child_generator(parent2->shared_from_this())) {
            check_direction(port1, port2, true);
            return {port1->port_direction() != PortDirection::In, true};
        } else if (parent2 == top && top->has_child_generator(parent1->shared_from_this())) {
            check_direction(port1, port2, true);
            return {(port1->port_direction() == PortDirection::In), true};
        } else if (parent1->parent() == parent2->parent() && parent1->parent() == top) {
            check_direction(port1, port2, false);
            return {(port1->port_direction() == PortDirection::In), true};
        } else {
            return {false, false};
        }
    }
}